

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O1

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,DataType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "int8_t";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "int16_t";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "int32_t";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "int64_t";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "uint8_t";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "uint16_t";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "uint32_t";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "uint64_t";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "float";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "double";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "long double";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "float complex";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "double complex";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "string";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "char";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "struct";
    pcVar1 = "";
    break;
  default:
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(DataType type)
{
    // Keep in sync with helper::GetDataTypeFromString
    switch (type)
    {
    case DataType::None:
        break;
    case DataType::Char:
        return "char";
    case DataType::Int8:
        return "int8_t";
    case DataType::Int16:
        return "int16_t";
    case DataType::Int32:
        return "int32_t";
    case DataType::Int64:
        return "int64_t";
    case DataType::UInt8:
        return "uint8_t";
    case DataType::UInt16:
        return "uint16_t";
    case DataType::UInt32:
        return "uint32_t";
    case DataType::UInt64:
        return "uint64_t";
    case DataType::Float:
        return "float";
    case DataType::Double:
        return "double";
    case DataType::LongDouble:
        return "long double";
    case DataType::FloatComplex:
        return "float complex";
    case DataType::DoubleComplex:
        return "double complex";
    case DataType::String:
        return "string";
    case DataType::Struct:
        return "struct";
    }
    return std::string();
}